

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEra2.c
# Opt level: O2

int Gia_ManArePrintListUsed(Gia_ManAre_t *p,Gia_PtrAre_t Root)

{
  Gia_StaAre_t *pGVar1;
  Gia_StaAre_t *pSta;
  uint **ppuVar2;
  
  ppuVar2 = p->ppStas;
  pGVar1 = (Gia_StaAre_t *)(ulong)((uint)Root >> 0x11 & 0x3ff8);
  pSta = (Gia_StaAre_t *)
         ((long)p->nSize * (ulong)((uint)Root & 0xfffff) * 4 +
         *(long *)((long)ppuVar2 + (long)pGVar1));
  while ((Gia_StaAre_t *)*ppuVar2 != pSta) {
    if (-1 < (int)pSta->iPrev) {
      Gia_ManArePrintCube(p,pSta);
      ppuVar2 = p->ppStas;
    }
    pGVar1 = Gia_StaNext(p,pSta);
    pSta = pGVar1;
  }
  return (int)pGVar1;
}

Assistant:

static inline int Gia_ManArePrintListUsed( Gia_ManAre_t * p, Gia_PtrAre_t Root )
{
    Gia_StaAre_t * pCube;
    Gia_ManAreForEachCubeList( p, Gia_ManAreSta(p, Root), pCube )
        if ( Gia_StaIsUsed(pCube) )
            Gia_ManArePrintCube( p, pCube );
    return 1;
}